

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncoding xmlParseCharEncoding(char *name)

{
  __int32_t _Var1;
  __int32_t *p_Var2;
  xmlCharEncoding xVar3;
  char *pcVar4;
  __int32_t **pp_Var5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char upper [500];
  char local_208 [504];
  
  if (name == (char *)0x0) {
    return XML_CHAR_ENCODING_NONE;
  }
  pcVar4 = xmlGetEncodingAlias(name);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = name;
  }
  pp_Var5 = __ctype_toupper_loc();
  p_Var2 = *pp_Var5;
  uVar6 = 0;
  do {
    _Var1 = p_Var2[pcVar4[uVar6]];
    local_208[uVar6] = (char)_Var1;
    if ((char)_Var1 == '\0') goto LAB_00143af2;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 499);
  uVar6 = 499;
LAB_00143af2:
  local_208[uVar6 & 0xffffffff] = '\0';
  if (local_208[0] == '\0') {
    xVar3 = XML_CHAR_ENCODING_NONE;
  }
  else {
    xVar3 = XML_CHAR_ENCODING_UTF8;
    if ((((CONCAT11(local_208[5],local_208[4]) != 0x38 ||
           CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
           0x2d465455) &&
         (local_208[4] != '\0' ||
          CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
          0x38465455)) &&
        (xVar3 = XML_CHAR_ENCODING_UTF16LE,
        CONCAT13(local_208[6],CONCAT12(local_208[5],CONCAT11(local_208[4],local_208[3]))) !=
        0x36312d ||
        CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
        0x2d465455)) &&
       (CONCAT11(local_208[5],local_208[4]) != 0x36 ||
        CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
        0x31465455)) {
      auVar7[0] = -(local_208[0] == 'I');
      auVar7[1] = -(local_208[1] == 'S');
      auVar7[2] = -(local_208[2] == 'O');
      auVar7[3] = -(local_208[3] == '-');
      auVar7[4] = -(local_208[4] == '1');
      auVar7[5] = -(local_208[5] == '0');
      auVar7[6] = -(local_208[6] == '6');
      auVar7[7] = -(local_208[7] == '4');
      auVar7[8] = -(local_208[8] == '6');
      auVar7[9] = -(local_208[9] == '-');
      auVar7[10] = -(local_208[10] == 'U');
      auVar7[0xb] = -(local_208[0xb] == 'C');
      auVar7[0xc] = -(local_208[0xc] == 'S');
      auVar7[0xd] = -(local_208[0xd] == '-');
      auVar7[0xe] = -(local_208[0xe] == '2');
      auVar7[0xf] = -(local_208[0xf] == '\0');
      xVar3 = XML_CHAR_ENCODING_UCS2;
      if ((((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar7[0xf] >> 7) << 0xf) != 0xffff) &&
          (CONCAT11(local_208[5],local_208[4]) != 0x32 ||
           CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
           0x2d534355)) &&
         (local_208[4] != '\0' ||
          CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
          0x32534355)) {
        auVar8[0] = -(local_208[0] == 'I');
        auVar8[1] = -(local_208[1] == 'S');
        auVar8[2] = -(local_208[2] == 'O');
        auVar8[3] = -(local_208[3] == '-');
        auVar8[4] = -(local_208[4] == '1');
        auVar8[5] = -(local_208[5] == '0');
        auVar8[6] = -(local_208[6] == '6');
        auVar8[7] = -(local_208[7] == '4');
        auVar8[8] = -(local_208[8] == '6');
        auVar8[9] = -(local_208[9] == '-');
        auVar8[10] = -(local_208[10] == 'U');
        auVar8[0xb] = -(local_208[0xb] == 'C');
        auVar8[0xc] = -(local_208[0xc] == 'S');
        auVar8[0xd] = -(local_208[0xd] == '-');
        auVar8[0xe] = -(local_208[0xe] == '4');
        auVar8[0xf] = -(local_208[0xf] == '\0');
        xVar3 = XML_CHAR_ENCODING_UCS4LE;
        if ((((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar8[0xf] >> 7) << 0xf) != 0xffff) &&
            (CONCAT11(local_208[5],local_208[4]) != 0x34 ||
             CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
             0x2d534355)) &&
           (((local_208[4] != '\0' ||
              CONCAT13(local_208[3],CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
              0x34534355 &&
             ((((xVar3 = XML_CHAR_ENCODING_8859_1,
                CONCAT17(local_208[10],
                         CONCAT16(local_208[9],
                                  CONCAT15(local_208[8],
                                           CONCAT14(local_208[7],
                                                    CONCAT13(local_208[6],
                                                             CONCAT12(local_208[5],
                                                                      CONCAT11(local_208[4],
                                                                               local_208[3])))))))
                != 0x312d393538382d ||
                CONCAT17(local_208[7],
                         CONCAT16(local_208[6],
                                  CONCAT15(local_208[5],
                                           CONCAT14(local_208[4],
                                                    CONCAT13(local_208[3],
                                                             CONCAT12(local_208[2],
                                                                      CONCAT11(local_208[1],
                                                                               local_208[0])))))))
                != 0x393538382d4f5349 &&
                (CONCAT13(local_208[0xb],CONCAT12(local_208[10],CONCAT11(local_208[9],local_208[8]))
                         ) != 0x312d4e ||
                 CONCAT17(local_208[7],
                          CONCAT16(local_208[6],
                                   CONCAT15(local_208[5],
                                            CONCAT14(local_208[4],
                                                     CONCAT13(local_208[3],
                                                              CONCAT12(local_208[2],
                                                                       CONCAT11(local_208[1],
                                                                                local_208[0])))))))
                 != 0x4954414c2d4f5349)) &&
               (CONCAT13(local_208[0xb],CONCAT12(local_208[10],CONCAT11(local_208[9],local_208[8])))
                != 0x31204e ||
                CONCAT17(local_208[7],
                         CONCAT16(local_208[6],
                                  CONCAT15(local_208[5],
                                           CONCAT14(local_208[4],
                                                    CONCAT13(local_208[3],
                                                             CONCAT12(local_208[2],
                                                                      CONCAT11(local_208[1],
                                                                               local_208[0])))))))
                != 0x4954414c204f5349)) &&
              ((xVar3 = XML_CHAR_ENCODING_8859_2,
               CONCAT17(local_208[10],
                        CONCAT16(local_208[9],
                                 CONCAT15(local_208[8],
                                          CONCAT14(local_208[7],
                                                   CONCAT13(local_208[6],
                                                            CONCAT12(local_208[5],
                                                                     CONCAT11(local_208[4],
                                                                              local_208[3]))))))) !=
               0x322d393538382d ||
               CONCAT17(local_208[7],
                        CONCAT16(local_208[6],
                                 CONCAT15(local_208[5],
                                          CONCAT14(local_208[4],
                                                   CONCAT13(local_208[3],
                                                            CONCAT12(local_208[2],
                                                                     CONCAT11(local_208[1],
                                                                              local_208[0]))))))) !=
               0x393538382d4f5349 &&
               (CONCAT13(local_208[0xb],CONCAT12(local_208[10],CONCAT11(local_208[9],local_208[8])))
                != 0x322d4e ||
                CONCAT17(local_208[7],
                         CONCAT16(local_208[6],
                                  CONCAT15(local_208[5],
                                           CONCAT14(local_208[4],
                                                    CONCAT13(local_208[3],
                                                             CONCAT12(local_208[2],
                                                                      CONCAT11(local_208[1],
                                                                               local_208[0])))))))
                != 0x4954414c2d4f5349)))))) &&
            (CONCAT13(local_208[0xb],CONCAT12(local_208[10],CONCAT11(local_208[9],local_208[8]))) !=
             0x32204e ||
             CONCAT17(local_208[7],
                      CONCAT16(local_208[6],
                               CONCAT15(local_208[5],
                                        CONCAT14(local_208[4],
                                                 CONCAT13(local_208[3],
                                                          CONCAT12(local_208[2],
                                                                   CONCAT11(local_208[1],
                                                                            local_208[0]))))))) !=
             0x4954414c204f5349)))) {
          if (CONCAT17(local_208[10],
                       CONCAT16(local_208[9],
                                CONCAT15(local_208[8],
                                         CONCAT14(local_208[7],
                                                  CONCAT13(local_208[6],
                                                           CONCAT12(local_208[5],
                                                                    CONCAT11(local_208[4],
                                                                             local_208[3]))))))) ==
              0x332d393538382d &&
              CONCAT17(local_208[7],
                       CONCAT16(local_208[6],
                                CONCAT15(local_208[5],
                                         CONCAT14(local_208[4],
                                                  CONCAT13(local_208[3],
                                                           CONCAT12(local_208[2],
                                                                    CONCAT11(local_208[1],
                                                                             local_208[0]))))))) ==
              0x393538382d4f5349) {
            xVar3 = XML_CHAR_ENCODING_8859_3;
          }
          else if (CONCAT17(local_208[10],
                            CONCAT16(local_208[9],
                                     CONCAT15(local_208[8],
                                              CONCAT14(local_208[7],
                                                       CONCAT13(local_208[6],
                                                                CONCAT12(local_208[5],
                                                                         CONCAT11(local_208[4],
                                                                                  local_208[3]))))))
                           ) == 0x342d393538382d &&
                   CONCAT17(local_208[7],
                            CONCAT16(local_208[6],
                                     CONCAT15(local_208[5],
                                              CONCAT14(local_208[4],
                                                       CONCAT13(local_208[3],
                                                                CONCAT12(local_208[2],
                                                                         CONCAT11(local_208[1],
                                                                                  local_208[0]))))))
                           ) == 0x393538382d4f5349) {
            xVar3 = XML_CHAR_ENCODING_8859_4;
          }
          else if (CONCAT17(local_208[10],
                            CONCAT16(local_208[9],
                                     CONCAT15(local_208[8],
                                              CONCAT14(local_208[7],
                                                       CONCAT13(local_208[6],
                                                                CONCAT12(local_208[5],
                                                                         CONCAT11(local_208[4],
                                                                                  local_208[3]))))))
                           ) == 0x352d393538382d &&
                   CONCAT17(local_208[7],
                            CONCAT16(local_208[6],
                                     CONCAT15(local_208[5],
                                              CONCAT14(local_208[4],
                                                       CONCAT13(local_208[3],
                                                                CONCAT12(local_208[2],
                                                                         CONCAT11(local_208[1],
                                                                                  local_208[0]))))))
                           ) == 0x393538382d4f5349) {
            xVar3 = XML_CHAR_ENCODING_8859_5;
          }
          else if (CONCAT17(local_208[10],
                            CONCAT16(local_208[9],
                                     CONCAT15(local_208[8],
                                              CONCAT14(local_208[7],
                                                       CONCAT13(local_208[6],
                                                                CONCAT12(local_208[5],
                                                                         CONCAT11(local_208[4],
                                                                                  local_208[3]))))))
                           ) == 0x362d393538382d &&
                   CONCAT17(local_208[7],
                            CONCAT16(local_208[6],
                                     CONCAT15(local_208[5],
                                              CONCAT14(local_208[4],
                                                       CONCAT13(local_208[3],
                                                                CONCAT12(local_208[2],
                                                                         CONCAT11(local_208[1],
                                                                                  local_208[0]))))))
                           ) == 0x393538382d4f5349) {
            xVar3 = XML_CHAR_ENCODING_8859_6;
          }
          else if (CONCAT17(local_208[10],
                            CONCAT16(local_208[9],
                                     CONCAT15(local_208[8],
                                              CONCAT14(local_208[7],
                                                       CONCAT13(local_208[6],
                                                                CONCAT12(local_208[5],
                                                                         CONCAT11(local_208[4],
                                                                                  local_208[3]))))))
                           ) == 0x372d393538382d &&
                   CONCAT17(local_208[7],
                            CONCAT16(local_208[6],
                                     CONCAT15(local_208[5],
                                              CONCAT14(local_208[4],
                                                       CONCAT13(local_208[3],
                                                                CONCAT12(local_208[2],
                                                                         CONCAT11(local_208[1],
                                                                                  local_208[0]))))))
                           ) == 0x393538382d4f5349) {
            xVar3 = XML_CHAR_ENCODING_8859_7;
          }
          else if (CONCAT17(local_208[10],
                            CONCAT16(local_208[9],
                                     CONCAT15(local_208[8],
                                              CONCAT14(local_208[7],
                                                       CONCAT13(local_208[6],
                                                                CONCAT12(local_208[5],
                                                                         CONCAT11(local_208[4],
                                                                                  local_208[3]))))))
                           ) == 0x382d393538382d &&
                   CONCAT17(local_208[7],
                            CONCAT16(local_208[6],
                                     CONCAT15(local_208[5],
                                              CONCAT14(local_208[4],
                                                       CONCAT13(local_208[3],
                                                                CONCAT12(local_208[2],
                                                                         CONCAT11(local_208[1],
                                                                                  local_208[0]))))))
                           ) == 0x393538382d4f5349) {
            xVar3 = XML_CHAR_ENCODING_8859_8;
          }
          else if (CONCAT17(local_208[10],
                            CONCAT16(local_208[9],
                                     CONCAT15(local_208[8],
                                              CONCAT14(local_208[7],
                                                       CONCAT13(local_208[6],
                                                                CONCAT12(local_208[5],
                                                                         CONCAT11(local_208[4],
                                                                                  local_208[3]))))))
                           ) == 0x392d393538382d &&
                   CONCAT17(local_208[7],
                            CONCAT16(local_208[6],
                                     CONCAT15(local_208[5],
                                              CONCAT14(local_208[4],
                                                       CONCAT13(local_208[3],
                                                                CONCAT12(local_208[2],
                                                                         CONCAT11(local_208[1],
                                                                                  local_208[0]))))))
                           ) == 0x393538382d4f5349) {
            xVar3 = XML_CHAR_ENCODING_8859_9;
          }
          else if (CONCAT13(local_208[0xb],
                            CONCAT12(local_208[10],CONCAT11(local_208[9],local_208[8]))) == 0x504a2d
                   && CONCAT17(local_208[7],
                               CONCAT16(local_208[6],
                                        CONCAT15(local_208[5],
                                                 CONCAT14(local_208[4],
                                                          CONCAT13(local_208[3],
                                                                   CONCAT12(local_208[2],
                                                                            CONCAT11(local_208[1],
                                                                                     local_208[0])))
                                                         )))) == 0x323230322d4f5349) {
            xVar3 = XML_CHAR_ENCODING_2022_JP;
          }
          else if (CONCAT11(local_208[9],local_208[8]) == 0x53 &&
                   CONCAT17(local_208[7],
                            CONCAT16(local_208[6],
                                     CONCAT15(local_208[5],
                                              CONCAT14(local_208[4],
                                                       CONCAT13(local_208[3],
                                                                CONCAT12(local_208[2],
                                                                         CONCAT11(local_208[1],
                                                                                  local_208[0]))))))
                           ) == 0x494a5f5446494853) {
            xVar3 = XML_CHAR_ENCODING_SHIFT_JIS;
          }
          else {
            xVar3 = -(uint)(CONCAT13(local_208[6],
                                     CONCAT12(local_208[5],CONCAT11(local_208[4],local_208[3]))) !=
                            0x504a2d ||
                           CONCAT13(local_208[3],
                                    CONCAT12(local_208[2],CONCAT11(local_208[1],local_208[0]))) !=
                           0x2d435545) | XML_CHAR_ENCODING_EUC_JP;
          }
        }
      }
    }
  }
  return xVar3;
}

Assistant:

xmlCharEncoding
xmlParseCharEncoding(const char* name)
{
    const char *alias;
    char upper[500];
    int i;

    if (name == NULL)
	return(XML_CHAR_ENCODING_NONE);

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    for (i = 0;i < 499;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (!strcmp(upper, "")) return(XML_CHAR_ENCODING_NONE);
    if (!strcmp(upper, "UTF-8")) return(XML_CHAR_ENCODING_UTF8);
    if (!strcmp(upper, "UTF8")) return(XML_CHAR_ENCODING_UTF8);

    /*
     * NOTE: if we were able to parse this, the endianness of UTF16 is
     *       already found and in use
     */
    if (!strcmp(upper, "UTF-16")) return(XML_CHAR_ENCODING_UTF16LE);
    if (!strcmp(upper, "UTF16")) return(XML_CHAR_ENCODING_UTF16LE);

    if (!strcmp(upper, "ISO-10646-UCS-2")) return(XML_CHAR_ENCODING_UCS2);
    if (!strcmp(upper, "UCS-2")) return(XML_CHAR_ENCODING_UCS2);
    if (!strcmp(upper, "UCS2")) return(XML_CHAR_ENCODING_UCS2);

    /*
     * NOTE: if we were able to parse this, the endianness of UCS4 is
     *       already found and in use
     */
    if (!strcmp(upper, "ISO-10646-UCS-4")) return(XML_CHAR_ENCODING_UCS4LE);
    if (!strcmp(upper, "UCS-4")) return(XML_CHAR_ENCODING_UCS4LE);
    if (!strcmp(upper, "UCS4")) return(XML_CHAR_ENCODING_UCS4LE);


    if (!strcmp(upper,  "ISO-8859-1")) return(XML_CHAR_ENCODING_8859_1);
    if (!strcmp(upper,  "ISO-LATIN-1")) return(XML_CHAR_ENCODING_8859_1);
    if (!strcmp(upper,  "ISO LATIN 1")) return(XML_CHAR_ENCODING_8859_1);

    if (!strcmp(upper,  "ISO-8859-2")) return(XML_CHAR_ENCODING_8859_2);
    if (!strcmp(upper,  "ISO-LATIN-2")) return(XML_CHAR_ENCODING_8859_2);
    if (!strcmp(upper,  "ISO LATIN 2")) return(XML_CHAR_ENCODING_8859_2);

    if (!strcmp(upper,  "ISO-8859-3")) return(XML_CHAR_ENCODING_8859_3);
    if (!strcmp(upper,  "ISO-8859-4")) return(XML_CHAR_ENCODING_8859_4);
    if (!strcmp(upper,  "ISO-8859-5")) return(XML_CHAR_ENCODING_8859_5);
    if (!strcmp(upper,  "ISO-8859-6")) return(XML_CHAR_ENCODING_8859_6);
    if (!strcmp(upper,  "ISO-8859-7")) return(XML_CHAR_ENCODING_8859_7);
    if (!strcmp(upper,  "ISO-8859-8")) return(XML_CHAR_ENCODING_8859_8);
    if (!strcmp(upper,  "ISO-8859-9")) return(XML_CHAR_ENCODING_8859_9);

    if (!strcmp(upper, "ISO-2022-JP")) return(XML_CHAR_ENCODING_2022_JP);
    if (!strcmp(upper, "SHIFT_JIS")) return(XML_CHAR_ENCODING_SHIFT_JIS);
    if (!strcmp(upper, "EUC-JP")) return(XML_CHAR_ENCODING_EUC_JP);

#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext, "Unknown encoding %s\n", name);
#endif
    return(XML_CHAR_ENCODING_ERROR);
}